

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall
tetgenmesh::facenormal(tetgenmesh *this,point pa,point pb,point pc,double *n,int pivot,double *lav)

{
  undefined1 auVar1 [16];
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double v2 [3];
  double local_38;
  double dStack_30;
  double local_28;
  double v3 [3];
  
  local_38 = *pb - *pa;
  v2[0] = *pa - *pc;
  dStack_30 = pb[1] - pa[1];
  v2[1] = pa[1] - pc[1];
  local_28 = pb[2] - pa[2];
  v2[2] = pa[2] - pc[2];
  if (pivot < 1) {
    pdVar2 = &local_38;
    pdVar3 = v2;
  }
  else {
    v3[0] = *pc - *pb;
    auVar5._8_8_ = pc[1] - pb[1];
    v3[1] = auVar5._8_8_;
    v3[2] = pc[2] - pb[2];
    dVar6 = local_28 * local_28 + local_38 * local_38 + dStack_30 * dStack_30;
    dVar8 = v2[2] * v2[2] + v2[0] * v2[0] + v2[1] * v2[1];
    auVar5._0_8_ = v3[0] * v3[0] + auVar5._8_8_ * auVar5._8_8_;
    pdVar3 = v3;
    if (dVar6 < dVar8) {
      pdVar3 = &local_38;
    }
    pdVar2 = v3;
    if (dVar8 <= dVar6) {
      pdVar2 = v2;
    }
    dVar4 = v3[2] * v3[2] + auVar5._0_8_;
    dVar9 = dVar8;
    if (dVar8 <= dVar6) {
      dVar9 = dVar6;
    }
    if (dVar9 < dVar4) {
      pdVar2 = &local_38;
      pdVar3 = v2;
    }
    if (lav != (double *)0x0) {
      auVar1._8_8_ = dVar8;
      auVar1._0_8_ = dVar6;
      auVar5 = sqrtpd(auVar5,auVar1);
      *lav = (SQRT(dVar4) + auVar5._8_8_ + auVar5._0_8_) / 3.0;
    }
  }
  dVar6 = *pdVar2;
  dVar8 = pdVar2[1];
  dVar9 = *pdVar3;
  dVar4 = pdVar3[1];
  dVar7 = pdVar3[2] * *pdVar2 - pdVar2[2] * *pdVar3;
  *n = -(pdVar3[2] * pdVar2[1] - pdVar2[2] * pdVar3[1]);
  n[1] = -dVar7;
  n[1] = dVar7;
  n[2] = -(dVar6 * dVar4 - dVar8 * dVar9);
  return;
}

Assistant:

void tetgenmesh::facenormal(point pa, point pb, point pc, REAL *n, int pivot,
                            REAL* lav)
{
  REAL v1[3], v2[3], v3[3], *pv1, *pv2;
  REAL L1, L2, L3;

  v1[0] = pb[0] - pa[0];  // edge vector v1: a->b
  v1[1] = pb[1] - pa[1];
  v1[2] = pb[2] - pa[2];
  v2[0] = pa[0] - pc[0];  // edge vector v2: c->a
  v2[1] = pa[1] - pc[1];
  v2[2] = pa[2] - pc[2];

  // Default, normal is calculated by: v1 x (-v2) (see Fig. fnormal).
  if (pivot > 0) {
    // Choose edge vectors by Burdakov's algorithm.
    v3[0] = pc[0] - pb[0];  // edge vector v3: b->c
    v3[1] = pc[1] - pb[1];
    v3[2] = pc[2] - pb[2];
    L1 = dot(v1, v1);
    L2 = dot(v2, v2);
    L3 = dot(v3, v3);
    // Sort the three edge lengths.
    if (L1 < L2) {
      if (L2 < L3) {
        pv1 = v1; pv2 = v2; // n = v1 x (-v2).
      } else {
        pv1 = v3; pv2 = v1; // n = v3 x (-v1).
      }
    } else {
      if (L1 < L3) {
        pv1 = v1; pv2 = v2; // n = v1 x (-v2).
      } else {
        pv1 = v2; pv2 = v3; // n = v2 x (-v3).
      }
    }
    if (lav) {
      // return the average edge length.
      *lav = (sqrt(L1) + sqrt(L2) + sqrt(L3)) / 3.0;
    }
  } else {
    pv1 = v1; pv2 = v2; // n = v1 x (-v2).
  }

  // Calculate the face normal.
  cross(pv1, pv2, n);
  // Inverse the direction;
  n[0] = -n[0];
  n[1] = -n[1];
  n[2] = -n[2];
}